

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

APInt * __thiscall llvm::APInt::clearUnusedBits(APInt *this)

{
  uint uVar1;
  APInt *pAVar2;
  
  pAVar2 = this;
  uVar1 = this->BitWidth;
  if (0x40 < (ulong)uVar1) {
    this = (APInt *)((this->U).pVal + ((int)((ulong)uVar1 + 0x3f >> 6) - 1));
  }
  (this->U).VAL = ((this->U).VAL << (-(char)uVar1 & 0x3fU)) >> (-(char)uVar1 & 0x3fU);
  return pAVar2;
}

Assistant:

APInt &clearUnusedBits() {
    // Compute how many bits are used in the final word
    unsigned WordBits = ((BitWidth-1) % APINT_BITS_PER_WORD) + 1;

    // Mask out the high bits.
    uint64_t mask = WORD_MAX >> (APINT_BITS_PER_WORD - WordBits);
    if (isSingleWord())
      U.VAL &= mask;
    else
      U.pVal[getNumWords() - 1] &= mask;
    return *this;
  }